

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestRuleAttributes::RegisterParserTestRuleAttributes
          (RegisterParserTestRuleAttributes *this)

{
  RegisterParserTestRuleAttributes *this_local;
  
  RegisterTest(ParserTestRuleAttributes::Create,"ParserTest.RuleAttributes");
  return;
}

Assistant:

TEST_F(ParserTest, RuleAttributes) {
  // Check that all of the allowed rule attributes are parsed ok.
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = a\n"
"  depfile = a\n"
"  deps = a\n"
"  description = a\n"
"  generator = a\n"
"  restat = a\n"
"  rspfile = a\n"
"  rspfile_content = a\n"
));
}